

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::flip_variable
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *this,uint *v)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  Scalar local_68;
  Vartype local_60 [14];
  
  if (this->m_vartype == BINARY) {
    local_60[0] = SPIN;
    change_vartype(this,local_60);
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->_label_to_idx,v);
    mVar1 = *pmVar2;
    local_68 = -1.0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_60,
               &this->_quadmat,mVar1);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
    operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_> *)
               local_60,&local_68);
    local_68 = -1.0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_60,
               &this->_quadmat,mVar1);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>_>::
    operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>_> *)
               local_60,&local_68);
    local_60[0] = BINARY;
    change_vartype(this,local_60);
  }
  else if (this->m_vartype == SPIN) {
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->_label_to_idx,v);
    mVar1 = *pmVar2;
    local_68 = -1.0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_60,
               &this->_quadmat,mVar1);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
    operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_> *)
               local_60,&local_68);
    local_68 = -1.0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_60,
               &this->_quadmat,mVar1);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>_>::
    operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>_> *)
               local_60,&local_68);
  }
  return;
}

Assistant:

void flip_variable( const IndexType &v ) {

      if ( m_vartype == Vartype::SPIN ) {
        size_t i = _label_to_idx.at( v );
        _quadmat.row( i ) *= -1;
        _quadmat.col( i ) *= -1;
      } else if ( m_vartype == Vartype::BINARY ) {
        // change vartype to spin
        this->change_vartype( Vartype::SPIN );

        size_t i = _label_to_idx.at( v );
        _quadmat.row( i ) *= -1;
        _quadmat.col( i ) *= -1;

        // change vartype to binary
        this->change_vartype( Vartype::BINARY );
      }
    }